

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O3

char * al_get_new_window_title(void)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001d9500);
  lVar2 = *plVar1;
  if (lVar2 == 0) {
    *plVar1 = (long)(plVar1 + 1);
    initialize_tls_values((thread_local_state *)(plVar1 + 1));
    lVar2 = *plVar1;
    if (lVar2 == 0) goto LAB_0015fcf6;
  }
  if (*(char *)(lVar2 + 0x124) != '\0') {
    return (char *)(lVar2 + 0x124);
  }
LAB_0015fcf6:
  pcVar3 = al_get_app_name();
  return pcVar3;
}

Assistant:

const char *al_get_new_window_title(void)
{
   thread_local_state *tls;

   /* Return app name in case of error or if not set before. */
   if ((tls = tls_get()) == NULL)
      return al_get_app_name();

   if (strlen(tls->new_window_title) < 1)
      return al_get_app_name();


   return (const char *)tls->new_window_title;
}